

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_rect nk_rectiv(int *r)

{
  nk_rect nVar1;
  
  nVar1.x = (float)*r;
  nVar1.w = (float)r[2];
  nVar1.y = (float)r[1];
  nVar1.h = (float)r[3];
  return nVar1;
}

Assistant:

NK_API struct nk_rect
nk_recti(int x, int y, int w, int h)
{
    struct nk_rect r;
    r.x = (float)x;
    r.y = (float)y;
    r.w = (float)w;
    r.h = (float)h;
    return r;
}